

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SRUP_Crypto.cpp
# Opt level: O1

int __thiscall
SRUP_Crypto::_verify
          (SRUP_Crypto *this,EVP_PKEY_CTX *ctx,uchar *sig,size_t siglen,uchar *tbs,size_t tbslen)

{
  int iVar1;
  BN_CTX *ctx_00;
  undefined8 unaff_RBP;
  uchar hash [32];
  uchar auStack_48 [32];
  
  if (siglen == 0) {
    iVar1 = 0;
  }
  else {
    SHA256((uchar *)ctx,(size_t)sig,auStack_48);
    ctx_00 = BN_CTX_new();
    RSA_blinding_on((RSA *)siglen,ctx_00);
    iVar1 = RSA_verify(0x2a0,auStack_48,0x20,this->m_signature,this->m_sig_length,(RSA *)siglen);
    iVar1 = (int)CONCAT71((int7)((ulong)unaff_RBP >> 8),iVar1 != 0);
    RSA_blinding_off((RSA *)siglen);
    BN_CTX_free(ctx_00);
    RSA_free((RSA *)siglen);
  }
  return iVar1;
}

Assistant:

bool SRUP_Crypto::_verify(unsigned char *data, size_t datasize, RSA *key)
{
    if (key == nullptr)
        return false;
    
    bool rval;
    BN_CTX* c;

    unsigned char hash[SHA256_DIGEST_LENGTH];
    SHA256(data, datasize, hash);

    c=BN_CTX_new();
    RSA_blinding_on(key, c);

    // Now perform the verify...
    rval = (bool) RSA_verify(NID_sha256, hash, SHA256_DIGEST_LENGTH, m_signature, m_sig_length, key);

    // ...and turn off the blinding
    RSA_blinding_off(key);
    BN_CTX_free(c);

    RSA_free(key);
    return rval;
}